

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1ee32::ClCommandLine::parse_command_line_options
          (ClCommandLine *this,string_stream *output,string_stream *errors)

{
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_arg;
  bool bVar1;
  allocator local_49;
  string local_48;
  
  first_arg._M_node =
       (this->strings_).
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::string((string *)&local_48,"overview",&local_49);
  bVar1 = pstore::command_line::details::
          parse_command_line_options<std::_List_iterator<std::__cxx11::string>,std::__cxx11::ostringstream,std::__cxx11::ostringstream>
                    (first_arg,
                     (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )&this->strings_,&local_48,output,errors);
  std::__cxx11::string::~string((string *)&local_48);
  return bVar1;
}

Assistant:

bool parse_command_line_options (string_stream & output, string_stream & errors) {
            return details::parse_command_line_options (std::begin (strings_), std::end (strings_),
                                                        "overview", output, errors);
        }